

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable_table.cpp
# Opt level: O3

void __thiscall
Variable_table::designate_variables_recursive(Variable_table *this,Node *current_node)

{
  pointer *pppVVar1;
  Node *pNVar2;
  pointer pcVar3;
  iterator __position;
  Variable *this_00;
  Variable *var;
  string name;
  Variable *local_48;
  string local_40;
  
  if (current_node != (Node *)0x0) {
    if (current_node->type == DCLRT) {
      pNVar2 = current_node->operand1->operand1;
      pcVar3 = (pNVar2->value)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar3,pcVar3 + (pNVar2->value)._M_string_length);
      this_00 = (Variable *)operator_new(0x28);
      Variable::Variable(this_00,&local_40,INTEGER);
      __position._M_current =
           (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48 = this_00;
      if (__position._M_current ==
          (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Variable*,std::allocator<Variable*>>::_M_realloc_insert<Variable*const&>
                  ((vector<Variable*,std::allocator<Variable*>> *)this,__position,&local_48);
      }
      else {
        *__position._M_current = this_00;
        pppVVar1 = &(this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppVVar1 = *pppVVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    designate_variables_recursive(this,current_node->operand1);
    designate_variables_recursive(this,current_node->operand2);
    designate_variables_recursive(this,current_node->operand3);
    designate_variables_recursive(this,current_node->operand4);
  }
  return;
}

Assistant:

void Variable_table::designate_variables_recursive(Node* current_node)
{
	if (current_node == nullptr) {
		return;
	}

	if (current_node->type == node_type::DCLRT) { 
		string name = current_node->operand1->operand1->value;
		Variable* var = new Variable(name, INTEGER);

		vars.push_back(var);
	}

	designate_variables_recursive(current_node->operand1);
	designate_variables_recursive(current_node->operand2);
	designate_variables_recursive(current_node->operand3);
	designate_variables_recursive(current_node->operand4);
}